

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::FloatImageTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,FloatImageTexture *this)

{
  MIPMap *in_R9;
  
  StringPrintf<pbrt::TextureMapping2DHandle_const&,float_const&,pbrt::MIPMap&>
            (__return_storage_ptr__,(pbrt *)"[ FloatImageTexture mapping: %s scale: %f mipmap: %s ]"
             ,(char *)this,(TextureMapping2DHandle *)&(this->super_ImageTextureBase).scale,
             (float *)(this->super_ImageTextureBase).mipmap,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatImageTexture::ToString() const {
    return StringPrintf("[ FloatImageTexture mapping: %s scale: %f mipmap: %s ]", mapping,
                        scale, *mipmap);
}